

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

void __thiscall duckdb::QuantileBindData::QuantileBindData(QuantileBindData *this,Value *quantile_p)

{
  bool bVar1;
  allocator_type local_d1;
  Value local_d0;
  QuantileValue local_90;
  
  (this->super_FunctionData)._vptr_FunctionData = (_func_int **)&PTR__QuantileBindData_027d1728;
  QuantileAbs<duckdb::Value>(&local_d0,quantile_p);
  QuantileValue::QuantileValue(&local_90,&local_d0);
  ::std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>::vector
            (&(this->quantiles).
              super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>,1,
             &local_90,&local_d1);
  Value::~Value(&local_90.val);
  Value::~Value(&local_d0);
  local_90.val.type_.id_ = INVALID;
  local_90.val.type_.physical_type_ = ~INVALID;
  local_90.val.type_._2_6_ = 0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&(this->order).super_vector<unsigned_long,_std::allocator<unsigned_long>_>,1,
             (value_type_conflict *)&local_90,(allocator_type *)&local_d0);
  local_90.val.type_.id_ = INVALID;
  local_90.val.type_.physical_type_ = ~INVALID;
  local_90.val.type_._2_6_ = 0;
  bVar1 = Value::operator<(quantile_p,(int64_t *)&local_90);
  this->desc = bVar1;
  return;
}

Assistant:

QuantileBindData::QuantileBindData(const Value &quantile_p)
    : quantiles(1, QuantileValue(QuantileAbs(quantile_p))), order(1, 0), desc(quantile_p < 0) {
}